

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_SpaceSign_Test::TestBody(FormatterTest_SpaceSign_Test *this)

{
  bool bVar1;
  format_error *e_6;
  bool gtest_caught_expected_6;
  string gtest_expected_message_6;
  AssertionResult gtest_ar_13;
  format_error *e_5;
  bool gtest_caught_expected_5;
  string gtest_expected_message_5;
  AssertionResult gtest_ar_12;
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_11;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7a0;
  char (*in_stack_fffffffffffff7a8) [4];
  char *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  char *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  Type in_stack_fffffffffffff7cc;
  AssertionResult *in_stack_fffffffffffff7d0;
  char (*in_stack_fffffffffffff7d8) [6];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  allocator *in_stack_fffffffffffff820;
  string local_568 [38];
  byte local_542;
  undefined1 local_541 [33];
  AssertionResult local_520 [3];
  string local_4f0 [38];
  byte local_4ca;
  allocator local_4c9;
  string local_4c8 [32];
  AssertionResult local_4a8 [3];
  undefined1 local_471;
  string local_470 [38];
  byte local_44a;
  allocator local_449;
  string local_448 [32];
  AssertionResult local_428 [3];
  undefined1 local_3f1;
  string local_3f0 [38];
  byte local_3ca;
  allocator local_3c9;
  string local_3c8 [32];
  AssertionResult local_3a8 [2];
  longdouble local_388;
  string local_378 [32];
  AssertionResult local_358 [2];
  undefined8 local_338;
  string local_330 [32];
  AssertionResult local_310 [3];
  undefined8 local_2e0;
  string local_2d8 [38];
  byte local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  AssertionResult local_290 [2];
  undefined8 local_270;
  string local_268 [32];
  AssertionResult local_248 [3];
  undefined8 local_218;
  string local_210 [38];
  byte local_1ea;
  allocator local_1e9;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  undefined8 local_1a8;
  string local_1a0 [32];
  AssertionResult local_180 [3];
  int local_150;
  undefined4 local_14c;
  string local_148 [38];
  byte local_122;
  allocator local_121;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  local_3c = 0x2a;
  fmt::v5::format<char[6],int>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x144e6a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x144ecd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x144f25);
  local_94 = 0xffffffd6;
  fmt::v5::format<char[6],int>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x145022);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x145085);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1450dd);
  local_dc = 0x2a;
  fmt::v5::format<char[6],int>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1451da);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x14523d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145295);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"format specifier requires signed argument",&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    local_122 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_14c = 0x2a;
      fmt::v5::format<char[6],unsigned_int>
                (in_stack_fffffffffffff7d8,(uint *)in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_148);
    }
    if ((local_122 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 2;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_120);
    if (local_150 != 0) goto LAB_0014563b;
  }
  else {
LAB_0014563b:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x145657);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x1456ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145712);
  local_1a8 = 0x2a;
  fmt::v5::format<char[6],long>(in_stack_fffffffffffff7d8,(long *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x145810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x145873);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1458cb);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"format specifier requires signed argument",&local_1e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    local_1ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_218 = 0x2a;
      fmt::v5::format<char[6],unsigned_long>
                (in_stack_fffffffffffff7d8,(unsigned_long *)in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_210);
    }
    if ((local_1ea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [103])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 3;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_1e8);
    if (local_150 != 0) goto LAB_00145c72;
  }
  else {
LAB_00145c72:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x145c8e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x145cf1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145d49);
  local_270 = 0x2a;
  fmt::v5::format<char[6],long_long>
            (in_stack_fffffffffffff7d8,(longlong *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x145e47);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x145eaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145f02);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"format specifier requires signed argument",&local_2b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    local_2b2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2e0 = 0x2a;
      fmt::v5::format<char[6],unsigned_long_long>
                (in_stack_fffffffffffff7d8,(unsigned_long_long *)in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_2d8);
    }
    if ((local_2b2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 4;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_2b0);
    if (local_150 != 0) goto LAB_001462a9;
  }
  else {
LAB_001462a9:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1462c5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x146328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x146380);
  local_338 = 0x4045000000000000;
  fmt::v5::format<char[6],double>(in_stack_fffffffffffff7d8,(double *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x146484);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x1464e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14653f);
  local_388 = (longdouble)42.0;
  fmt::v5::format<char[6],long_double>
            (in_stack_fffffffffffff7d8,(longdouble *)in_stack_fffffffffffff7d0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_358);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x14663e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x1466a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1466f9);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,"missing \'}\' in format string",&local_3c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    local_3ca = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_3f1 = 99;
      fmt::v5::format<char[5],char>
                ((char (*) [5])in_stack_fffffffffffff7d8,&in_stack_fffffffffffff7d0->success_);
      std::__cxx11::string::~string(local_3f0);
    }
    if ((local_3ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [101])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 5;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_3c8);
    if (local_150 != 0) goto LAB_00146a9c;
  }
  else {
LAB_00146a9c:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x146ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x146b1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x146b73);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"invalid format specifier for char",&local_449);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    local_44a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_471 = 99;
      fmt::v5::format<char[6],char>(in_stack_fffffffffffff7d8,&in_stack_fffffffffffff7d0->success_);
      std::__cxx11::string::~string(local_470);
    }
    if ((local_44a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 6;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_448);
    if (local_150 != 0) goto LAB_00146f16;
  }
  else {
LAB_00146f16:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x146f32);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x146f95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x146fed);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (bVar1) {
    in_stack_fffffffffffff820 = &local_4c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4c8,"format specifier requires numeric argument",in_stack_fffffffffffff820);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    local_4ca = 0;
    in_stack_fffffffffffff81f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff81f) {
      fmt::v5::format<char[6],char[4]>
                (in_stack_fffffffffffff7d8,&in_stack_fffffffffffff7d0->success_);
      std::__cxx11::string::~string(local_4f0);
    }
    if ((local_4ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 7;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string(local_4c8);
    if (local_150 != 0) goto LAB_00147369;
  }
  else {
LAB_00147369:
    testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
    testing::AssertionResult::failure_message((AssertionResult *)0x147385);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff820,
               (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    testing::Message::~Message((Message *)0x1473e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14743a);
  this_00 = local_520;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffff7d0 = (AssertionResult *)local_541;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_541 + 1),"format specifier requires numeric argument",
               (allocator *)in_stack_fffffffffffff7d0);
    std::allocator<char>::~allocator((allocator<char> *)local_541);
    local_542 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff7cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7cc);
    if (bVar1) {
      fmt::v5::format<char[6],void*>(&this_00->success_,(void **)in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_568);
    }
    if ((local_542 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff7d0,
                 (char (*) [128])CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_150 = 8;
    }
    else {
      local_150 = 0;
    }
    std::__cxx11::string::~string((string *)(local_541 + 1));
    if (local_150 == 0) goto LAB_00147864;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff7d0);
  testing::AssertionResult::failure_message((AssertionResult *)0x1477c1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
             in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffff820,
             (Message *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
  testing::Message::~Message((Message *)0x14781c);
LAB_00147864:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147871);
  return;
}

Assistant:

TEST(FormatterTest, SpaceSign) {
  EXPECT_EQ(" 42", format("{0: }", 42));
  EXPECT_EQ("-42", format("{0: }", -42));
  EXPECT_EQ(" 42", format("{0: }", 42));
  EXPECT_THROW_MSG(format("{0: }", 42u),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ(" 42", format("{0: }", 42l));
  EXPECT_THROW_MSG(format("{0: }", 42ul),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ(" 42", format("{0: }", 42ll));
  EXPECT_THROW_MSG(format("{0: }", 42ull),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ(" 42", format("{0: }", 42.0));
  EXPECT_EQ(" 42", format("{0: }", 42.0l));
  EXPECT_THROW_MSG(format("{0: ", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0: }", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0: }", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0: }", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}